

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O1

bool __thiscall duckdb::AsOfProbeBuffer::HasMoreData(AsOfProbeBuffer *this)

{
  pointer pPVar1;
  pointer pRVar2;
  bool bVar3;
  
  bVar3 = true;
  if (this->fetch_next_left == true) {
    if ((this->lhs_scanner).
        super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t.
        super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>
        .super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl ==
        (PayloadScanner *)0x0) {
      return false;
    }
    pPVar1 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
             operator->(&this->lhs_scanner);
    pRVar2 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
             ::operator->(&pPVar1->scanner);
    bVar3 = pRVar2->total_count != pRVar2->total_scanned;
  }
  return bVar3;
}

Assistant:

bool HasMoreData() const {
		return !fetch_next_left || (lhs_scanner && lhs_scanner->Remaining());
	}